

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O2

void __thiscall Nova::Parse_Args::Print_Usage(Parse_Args *this,bool do_exit)

{
  pointer pbVar1;
  ostream *poVar2;
  size_type *psVar3;
  pointer pAVar4;
  uint j;
  long lVar5;
  ulong uVar6;
  int iVar7;
  pointer pAVar8;
  ulong uVar9;
  bool bVar10;
  
  poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->program_name);
  std::operator<<(poVar2," ");
  lVar5 = 0;
  for (uVar9 = 0;
      pAVar8 = (this->arg_data_list).
               super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar9 < (ulong)(((long)(this->arg_data_list).
                             super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pAVar8) / 0x138);
      uVar9 = uVar9 + 1) {
    Arg_Data::Print_Synopsis((Arg_Data *)((long)&pAVar8->type + lVar5));
    std::operator<<(Log::(anonymous_namespace)::cerr," ");
    lVar5 = lVar5 + 0x138;
  }
  lVar5 = 0;
  uVar9 = 0;
  while( true ) {
    pbVar1 = (this->extra_args_synopsis_list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->extra_args_synopsis_list).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,
                             (string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
    std::operator<<(poVar2," ");
    uVar9 = uVar9 + 1;
    lVar5 = lVar5 + 0x20;
  }
  std::endl<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr);
  pAVar8 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = ((long)pAVar4 - (long)pAVar8) / 0x138;
  psVar3 = &(pAVar8->str)._M_string_length;
  iVar7 = 0;
  while (bVar10 = lVar5 != 0, lVar5 = lVar5 + -1, bVar10) {
    if (iVar7 <= (int)*psVar3) {
      iVar7 = (int)*psVar3;
    }
    psVar3 = psVar3 + 0x27;
  }
  lVar5 = (long)(this->extra_args_desc_list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->extra_args_desc_list).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  psVar3 = &((this->extra_args_synopsis_list).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
  while (bVar10 = lVar5 != 0, lVar5 = lVar5 + -1, bVar10) {
    if (iVar7 <= (int)*psVar3) {
      iVar7 = (int)*psVar3;
    }
    psVar3 = psVar3 + 4;
  }
  lVar5 = 0;
  for (uVar9 = 0; uVar9 < (ulong)(((long)pAVar4 - (long)pAVar8) / 0x138); uVar9 = uVar9 + 1) {
    Arg_Data::Print_Description((Arg_Data *)((long)&pAVar8->type + lVar5),iVar7 + 2U);
    std::endl<char,std::char_traits<char>>(Log::(anonymous_namespace)::cerr);
    pAVar8 = (this->arg_data_list).
             super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    pAVar4 = (this->arg_data_list).
             super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = lVar5 + 0x138;
  }
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(this->extra_args_desc_list).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->extra_args_desc_list).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
    std::operator<<(Log::(anonymous_namespace)::cerr,
                    (string *)
                    ((this->extra_args_synopsis_list).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9));
    uVar6 = 1;
    while( true ) {
      if ((ulong)(iVar7 + 2U) -
          (this->extra_args_synopsis_list).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_string_length < uVar6) break;
      std::operator<<(Log::(anonymous_namespace)::cerr," ");
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,
                             (string *)
                             ((this->extra_args_desc_list).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar9));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (this->extra_usage_callback != (_func_void *)0x0) {
    (*this->extra_usage_callback)();
  }
  if (!do_exit) {
    return;
  }
  exit(-1);
}

Assistant:

void Parse_Args::
Print_Usage(bool do_exit) const
{
    int i;
    Log::cerr<<"Usage: "<<program_name<<" ";
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Synopsis();
        Log::cerr<<" ";
    }
    for(i=0;i<extra_args_synopsis_list.size();i++) Log::cerr<<extra_args_synopsis_list[i]<<" ";
    Log::cerr<<std::endl;

    int width=0,len;
    for(i=0;i<arg_data_list.size();i++)
    {
        len=(int)arg_data_list[i].str.length();
        if(len>width) width=len;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        len=(int)extra_args_synopsis_list[i].length();
        if(len>width) width=len;
    }
    for(i=0;i<arg_data_list.size();i++)
    {
        arg_data_list[i].Print_Description(width+2);
        Log::cerr<<std::endl;
    }
    for(i=0;i<extra_args_desc_list.size();i++)
    {
        Log::cerr<<extra_args_synopsis_list[i];
        for(unsigned j=1;j<=width+2-extra_args_synopsis_list[i].length();j++) Log::cerr<<" ";
        Log::cerr<<extra_args_desc_list[i]<<std::endl;
    }
    if(extra_usage_callback) extra_usage_callback();
    if(do_exit) exit(-1);
}